

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets_tests.cpp
# Opt level: O0

void AddMulti(TimeOffsets *offsets,
             vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
             *to_add)

{
  long lVar1;
  bool bVar2;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *in_RSI;
  long in_FS_OFFSET;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *__range1;
  duration<long,_std::ratio<1L,_1L>_> offset;
  const_iterator __end1;
  const_iterator __begin1;
  seconds in_stack_00000048;
  __normal_iterator<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
  *in_stack_ffffffffffffffb8;
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  *__lhs;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  __lhs = in_RSI;
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::begin(in_RSI);
  std::
  vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
  ::end(in_RSI);
  while( true ) {
    bVar2 = __gnu_cxx::
            operator==<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                      ((__normal_iterator<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                        *)__lhs,(__normal_iterator<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
                                 *)in_RSI);
    if (((bVar2 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
    ::operator*(in_stack_ffffffffffffffb8);
    TimeOffsets::Add((TimeOffsets *)__range1,in_stack_00000048);
    __gnu_cxx::
    __normal_iterator<const_std::chrono::duration<long,_std::ratio<1L,_1L>_>_*,_std::vector<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>_>
    ::operator++(in_stack_ffffffffffffffb8);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void AddMulti(TimeOffsets& offsets, const std::vector<std::chrono::seconds>& to_add)
{
    for (auto offset : to_add) {
        offsets.Add(offset);
    }
}